

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaft.cpp
# Opt level: O2

void __thiscall chrono::ChShaft::ArchiveOUT(ChShaft *this,ChArchiveOut *marchive)

{
  ChNameValue<bool> local_168;
  ChNameValue<bool> local_150;
  ChNameValue<float> local_138;
  ChNameValue<float> local_120;
  ChNameValue<float> local_108;
  ChNameValue<float> local_f0;
  ChNameValue<float> local_d8;
  ChNameValue<bool> local_c0;
  ChNameValue<bool> local_a8;
  ChNameValue<double> local_90;
  ChNameValue<double> local_78;
  ChNameValue<double> local_60;
  ChNameValue<double> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChShaft>(marchive);
  ChPhysicsItem::ArchiveOUT(&this->super_ChPhysicsItem,marchive);
  local_30._value = &this->torque;
  local_30._name = "torque";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->pos;
  local_48._name = "pos";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  local_60._value = &this->pos_dt;
  local_60._name = "pos_dt";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_60);
  local_78._value = &this->pos_dtdt;
  local_78._name = "pos_dtdt";
  local_78._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_78);
  local_90._value = &this->inertia;
  local_90._name = "inertia";
  local_90._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_90);
  local_a8._value = &this->fixed;
  local_a8._name = "fixed";
  local_a8._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_a8);
  local_c0._value = &this->limitspeed;
  local_c0._name = "limitspeed";
  local_c0._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_c0);
  local_d8._value = &this->max_speed;
  local_d8._name = "max_speed";
  local_d8._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_d8);
  local_f0._value = &this->sleep_time;
  local_f0._name = "sleep_time";
  local_f0._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_f0);
  local_108._value = &this->sleep_starttime;
  local_108._name = "sleep_starttime";
  local_108._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_108);
  local_120._value = &this->sleep_minspeed;
  local_120._name = "sleep_minspeed";
  local_120._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_120);
  local_138._value = &this->sleep_minwvel;
  local_138._name = "sleep_minwvel";
  local_138._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_138);
  local_150._value = &this->sleeping;
  local_150._name = "sleeping";
  local_150._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_150);
  local_168._value = &this->use_sleeping;
  local_168._name = "use_sleeping";
  local_168._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_168);
  return;
}

Assistant:

void ChShaft::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChShaft>();

    // serialize parent class
    ChPhysicsItem::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(torque);
    marchive << CHNVP(pos);
    marchive << CHNVP(pos_dt);
    marchive << CHNVP(pos_dtdt);
    marchive << CHNVP(inertia);
    marchive << CHNVP(fixed);
    marchive << CHNVP(limitspeed);
    marchive << CHNVP(max_speed);
    marchive << CHNVP(sleep_time);
    marchive << CHNVP(sleep_starttime);
    marchive << CHNVP(sleep_minspeed);
    marchive << CHNVP(sleep_minwvel);
    marchive << CHNVP(sleeping);
    marchive << CHNVP(use_sleeping);
}